

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O2

bool __thiscall
ObjectModelBuilder::buildMaybeResource(ObjectModelBuilder *this,value *value,Class *clazz)

{
  bool bVar1;
  string *resourceString;
  ostream *poVar2;
  
  if (value->type_ == 3) {
    resourceString = picojson::value::get<std::__cxx11::string>(value);
    bVar1 = buildResource(this,resourceString,clazz);
    return bVar1;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"error: resource in class=\'");
  poVar2 = std::operator<<(poVar2,(string *)clazz);
  poVar2 = std::operator<<(poVar2,"\' is not a JSON string..");
  std::endl<char,std::char_traits<char>>(poVar2);
  return false;
}

Assistant:

bool ObjectModelBuilder::buildMaybeResource(const picojson::value &value, Class *clazz)
{
    if (!value.is<std::string>()) {
        std::cerr << "error: resource in class='" << clazz->name << "' is not a JSON string.." << std::endl;
        return false;
    }
    return buildResource(value.get<std::string>(), clazz);
}